

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpSubgraphStart
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub,char *name)

{
  ostream *poVar1;
  size_t sVar2;
  ostream *poVar3;
  DG2Dot<dg::LLVMNode> *this_00;
  char *in_RDX;
  DependenceGraphBase *in_RSI;
  DependenceGraph<dg::LLVMNode> *in_RDI;
  uint64_t slice_id;
  int ind;
  
  poVar1 = std::operator<<((ostream *)
                           &(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           "\t/* subgraph ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1," nodes */\n");
  poVar1 = std::operator<<((ostream *)
                           &(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           "\tsubgraph cluster_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1," {\n");
  std::operator<<((ostream *)&(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\t\tstyle=\"filled, rounded\" fillcolor=gray95\n");
  std::operator<<((ostream *)&(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\t\tlabel=\"Subgraph ");
  if (in_RDX != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)
                             &(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             in_RDX);
    std::operator<<(poVar1," ");
  }
  poVar1 = std::operator<<((ostream *)
                           &(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,"]");
  poVar1 = std::operator<<(poVar1,"\\nhas ");
  sVar2 = DependenceGraph<dg::LLVMNode>::size((DependenceGraph<dg::LLVMNode> *)0x1bccdf);
  poVar3 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  ind = (int)((ulong)poVar1 >> 0x20);
  std::operator<<(poVar3," nodes\n");
  this_00 = (DG2Dot<dg::LLVMNode> *)DependenceGraphBase::getSlice(in_RSI);
  if (this_00 != (DG2Dot<dg::LLVMNode> *)0x0) {
    poVar1 = std::operator<<((ostream *)
                             &(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             "\\nslice: ");
    std::ostream::operator<<(poVar1,(ulong)this_00);
  }
  std::operator<<((ostream *)&(in_RDI->nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "\"\n");
  dump_parameters(this_00,in_RDI,ind);
  return;
}

Assistant:

void dumpSubgraphStart(DependenceGraph<NodeT> *sub,
                           const char *name = nullptr) {
        out << "\t/* subgraph " << sub << " nodes */\n";
        out << "\tsubgraph cluster_" << sub << " {\n";
        out << "\t\tstyle=\"filled, rounded\" fillcolor=gray95\n";
        out << "\t\tlabel=\"Subgraph ";
        if (name)
            out << name << " ";

        out << "[" << sub << "]"
            << "\\nhas " << sub->size() << " nodes\n";

        uint64_t slice_id = sub->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        out << "\"\n";

        // dump BBs of the formal parameters
        dump_parameters(sub, 2);
    }